

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * make_voice_path(OpenJTalk *oj,char *path)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *in_RSI;
  char *in_RDI;
  char *d;
  char *s;
  char *r;
  uint c_1;
  char name_extended [260];
  uint c;
  char temp [260];
  char *in_stack_000002e8;
  char *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  char *local_258;
  char *local_250;
  char local_238 [268];
  undefined4 local_12c;
  char local_128 [208];
  char *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffdc;
  uint *in_stack_ffffffffffffffe0;
  char *in_stack_fffffffffffffff8;
  
  if (in_RDI == (char *)0x0) {
    return (char *)0x0;
  }
  clear_path_string(in_stack_fffffffffffffda0,(size_t)in_stack_fffffffffffffd98);
  if ((in_RSI == (char *)0x0) || (sVar3 = strlen(in_RSI), sVar3 == 0)) {
    if ((in_RDI == (char *)0xfffffffffffffef4) || (sVar3 = strlen(in_RDI + 0x10c), sVar3 == 0)) {
      return (char *)0x0;
    }
    local_12c = 0;
    _Var2 = search_file_recursive
                      (in_stack_fffffffffffffff8,in_RDI,in_RSI,in_stack_ffffffffffffffe0,
                       in_stack_ffffffffffffffdc);
    if (!_Var2) {
      local_12c = 0;
      _Var2 = search_file_recursive
                        (in_stack_fffffffffffffff8,in_RDI,in_RSI,in_stack_ffffffffffffffe0,
                         in_stack_ffffffffffffffdc);
      if (!_Var2) {
        return (char *)0x0;
      }
    }
  }
  else {
    _Var2 = is_name_only(in_stack_000002e8);
    if (!_Var2) {
      _Var2 = is_relative(in_stack_ffffffffffffffa8);
      if (_Var2) {
        if ((in_RDI != (char *)0xfffffffffffffef4) && (sVar3 = strlen(in_RDI + 0x10c), sVar3 != 0))
        {
          sVar3 = strlen(in_RDI + 0x10c);
          pcVar5 = (char *)(sVar3 + 1);
          sVar3 = strlen(in_RSI);
          if ((char *)0x104 < pcVar5 + sVar3 + 1) {
            return (char *)0x0;
          }
          strcpy(local_128,in_RDI + 0x10c);
          strcat(local_128,G_SLASH_CHAR);
          strcat(local_128,in_RSI);
          _Var2 = exists_file(pcVar5);
          if (_Var2) goto LAB_00195cf3;
        }
      }
      else {
        strcpy(local_128,in_RSI);
        _Var2 = exists_file(in_stack_fffffffffffffd98);
        if (_Var2) goto LAB_00195cf3;
      }
      return (char *)0x0;
    }
    sVar3 = strlen(in_RSI);
    sVar4 = strlen(G_VOICE_EXT);
    if (0x104 < sVar3 + sVar4 + 1) {
      return (char *)0x0;
    }
    pcVar5 = strcpy(local_238,in_RSI);
    strcat(pcVar5,G_VOICE_EXT);
    _Var2 = search_file_recursive
                      (in_stack_fffffffffffffff8,in_RDI,in_RSI,in_stack_ffffffffffffffe0,
                       in_stack_ffffffffffffffdc);
    if (!_Var2) {
      return (char *)0x0;
    }
  }
LAB_00195cf3:
  sVar3 = strlen(local_128);
  pcVar5 = (char *)malloc(sVar3 + 1);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    local_258 = pcVar5;
    local_250 = local_128;
    do {
      cVar1 = *local_250;
      *local_258 = cVar1;
      local_258 = local_258 + 1;
      local_250 = local_250 + 1;
    } while (cVar1 != '\0');
  }
  return pcVar5;
}

Assistant:

char *make_voice_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return NULL;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// パスが指定されていないとき、
	if (path == NULL || strlen(path) == 0)
	{
		// 音響モデルファイルフォルダが確定されていれば
		if (oj->dn_voice_dir_path != NULL && strlen(oj->dn_voice_dir_path) != 0)
		{
			// 標準名の音響モデルファイルを探す
			unsigned int c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, G_VOICE_DEFAULT, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}

			// 無ければ、何か音響モデルファイルを探す
			c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, G_VOICE_WILDCARD, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}
		}

		// パスが指定されていないとき、決まらなければ、偽を返す
		return NULL;
	}
	// パスが指定されているとき
	else
	{
		// 名前のみの表記の場合、
		if (is_name_only(path))
		{
			if (strlen(path) + strlen(G_VOICE_EXT) + 1 > MAX_PATH)
			{
				return NULL;
			}

			char name_extended[MAX_PATH];
			strcat(strcpy(name_extended, path), G_VOICE_EXT);
			unsigned int c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, name_extended, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}
			return NULL;
		}

		// 相対指定の場合、
		if (is_relative(path))
		{
			if (oj->dn_voice_dir_path != NULL && strlen(oj->dn_voice_dir_path) != 0)
			{
				if (strlen(oj->dn_voice_dir_path) + 1 + strlen(path) + 1 > MAX_PATH)
				{
					return false;
				}

				strcpy(temp, oj->dn_voice_dir_path);
				strcat(temp, G_SLASH_CHAR);
				strcat(temp, path);
				if (exists_file(temp))
				{
					goto return_true;
				}
			}
		}
		// 絶対指定の場合、
		else
		{
			strcpy(temp, path);
			if (exists_file(temp))
			{
				goto return_true;
			}
		}
	}
	return NULL;

return_true:
	if (temp == NULL)
	{
		return NULL;
	}
	char *r = malloc(strlen(temp) + 1);
	if (r == NULL)
	{
		return NULL;
	}
	char *s = temp;
	char *d = r;
	while ((*d++ = *s++) != '\0')
	{
	}
	return r;
}